

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modjpeg.c
# Opt level: O3

void help(void)

{
  fwrite("modjpeg (c) 2006+ Ingo Oppermann\n\n",0x22,1,_stderr);
  fwrite("The order for the options is important, i.e. a dropon can\'t be applied without\n",0x4f,1,
         _stderr);
  fwrite("loading an image first.\n\n",0x19,1,_stderr);
  fwrite("Options:\n\n",10,1,_stderr);
  fwrite("\t--input, -i file\n",0x12,1,_stderr);
  fwrite("\t\tPath to the image to be modified. The image needs to be a JPEG.\n",0x42,1,_stderr);
  fputc(10,_stderr);
  fwrite("\t--ouput, -o file\n",0x12,1,_stderr);
  fwrite("\t\tPath to a file to store the modified image in.\n",0x31,1,_stderr);
  fputc(10,_stderr);
  fwrite("\t--dropon, -d file[,mask]\n",0x1a,1,_stderr);
  fwrite("\t\tPath to the image that should be used as dropon. The path to the mask is optional.\n",
         0x55,1,_stderr);
  fwrite("\t\tThe dropon and the mask have to be a JPEG and of the same dimension.\n",0x47,1,_stderr
        );
  fputc(10,_stderr);
  fwrite("\t--position, -p [t|b][c][l|r]\n",0x1e,1,_stderr);
  fwrite("\t\tThe position of the dropon. t = top, b = bottom, l = left, r = right, c = center. Default: center\n"
         ,100,1,_stderr);
  fputc(10,_stderr);
  fwrite("\t--offset, -m [horizontal],[vertical]\n",0x26,1,_stderr);
  fwrite("\t\tThe offset to the given position in pixels. Default: 0,0\n",0x3b,1,_stderr);
  fputc(10,_stderr);
  fwrite("\t--luminance, -y value\n",0x17,1,_stderr);
  fwrite("\t\tChanges the brightness of the image according to the value. Use a negative value\n",
         0x53,1,_stderr);
  fwrite("\t\tto darken the image, and a positive value to brighten the image.\n",0x43,1,_stderr);
  fputc(10,_stderr);
  fwrite("\t--tintblue, -b value\n",0x16,1,_stderr);
  fwrite("\t\tColor the image. Use a negative value to tint the image yellow, and use a positive\n",
         0x55,1,_stderr);
  fwrite("\t\tvalue to tint the image blue.\n",0x20,1,_stderr);
  fputc(10,_stderr);
  fwrite("\t--tintred, -r value\n",0x15,1,_stderr);
  fwrite("\t\tColor the image. Use a negative value to tint the image green, and use a positive\n",
         0x54,1,_stderr);
  fwrite("\t\tvalue to tint the image red.\n",0x1f,1,_stderr);
  fputc(10,_stderr);
  fwrite("\t--pixelate, -x\n",0x10,1,_stderr);
  fwrite("\t\tPixelate the image into 8x8 blocks.\n",0x26,1,_stderr);
  fputc(10,_stderr);
  fwrite("\t--grayscale, -g\n",0x11,1,_stderr);
  fwrite("\t\tReduce the image to grayscale.\n",0x21,1,_stderr);
  fputc(10,_stderr);
  fwrite("\t--optimize, -O\n",0x10,1,_stderr);
  fwrite("\t\tOptimize the Huffman tables on storing the output image.\n",0x3b,1,_stderr);
  fputc(10,_stderr);
  fwrite("\t--progressive, -P\n",0x13,1,_stderr);
  fwrite("\t\tStore the output image in progressive mode.\n",0x2e,1,_stderr);
  fputc(10,_stderr);
  fwrite("\t--arithmetric, -A\n",0x13,1,_stderr);
  fwrite("\t\tUse arithmetric coding instead of Huffman coding.\n",0x34,1,_stderr);
  fputc(10,_stderr);
  fwrite("Examples:\n",10,1,_stderr);
  fputc(10,_stderr);
  fwrite("\tPlace a logo in the top right corner:\n",0x27,1,_stderr);
  fwrite("\t\tmodjpeg --input in.jpg --position tr --dropon logo.jpg --output out.jpg\n",0x4a,1,
         _stderr);
  fputc(10,_stderr);
  fwrite("\tPixelate the image and then place a logo in the top right corner:\n",0x43,1,_stderr);
  fwrite("\t\tmodjpeg --input in.jpg --pixelate --position tr --dropon logo.jpg --output out.jpg\n",
         0x55,1,_stderr);
  fputc(10,_stderr);
  fwrite("\tPlace a logo in the top right corner and then pixelate the image (including the logo):\n"
         ,0x58,1,_stderr);
  fwrite("\t\tmodjpeg --input in.jpg --position tr --dropon logo.jpg --pixelate --output out.jpg\n",
         0x55,1,_stderr);
  fputc(10,_stderr);
  fputc(10,_stderr);
  return;
}

Assistant:

void help(void) {
    fprintf(stderr, "modjpeg (c) 2006+ Ingo Oppermann\n\n");

    fprintf(stderr, "The order for the options is important, i.e. a dropon can't be applied without\n");
    fprintf(stderr, "loading an image first.\n\n");

    fprintf(stderr, "Options:\n\n");

    fprintf(stderr, "\t--input, -i file\n");
    fprintf(stderr, "\t\tPath to the image to be modified. The image needs to be a JPEG.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--ouput, -o file\n");
    fprintf(stderr, "\t\tPath to a file to store the modified image in.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--dropon, -d file[,mask]\n");
    fprintf(stderr, "\t\tPath to the image that should be used as dropon. The path to the mask is optional.\n");
    fprintf(stderr, "\t\tThe dropon and the mask have to be a JPEG and of the same dimension.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--position, -p [t|b][c][l|r]\n");
    fprintf(stderr, "\t\tThe position of the dropon. t = top, b = bottom, l = left, r = right, c = center. Default: center\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--offset, -m [horizontal],[vertical]\n");
    fprintf(stderr, "\t\tThe offset to the given position in pixels. Default: 0,0\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--luminance, -y value\n");
    fprintf(stderr, "\t\tChanges the brightness of the image according to the value. Use a negative value\n");
    fprintf(stderr, "\t\tto darken the image, and a positive value to brighten the image.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--tintblue, -b value\n");
    fprintf(stderr, "\t\tColor the image. Use a negative value to tint the image yellow, and use a positive\n");
    fprintf(stderr, "\t\tvalue to tint the image blue.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--tintred, -r value\n");
    fprintf(stderr, "\t\tColor the image. Use a negative value to tint the image green, and use a positive\n");
    fprintf(stderr, "\t\tvalue to tint the image red.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--pixelate, -x\n");
    fprintf(stderr, "\t\tPixelate the image into 8x8 blocks.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--grayscale, -g\n");
    fprintf(stderr, "\t\tReduce the image to grayscale.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--optimize, -O\n");
    fprintf(stderr, "\t\tOptimize the Huffman tables on storing the output image.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--progressive, -P\n");
    fprintf(stderr, "\t\tStore the output image in progressive mode.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--arithmetric, -A\n");
    fprintf(stderr, "\t\tUse arithmetric coding instead of Huffman coding.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "Examples:\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\tPlace a logo in the top right corner:\n");
    fprintf(stderr, "\t\tmodjpeg --input in.jpg --position tr --dropon logo.jpg --output out.jpg\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\tPixelate the image and then place a logo in the top right corner:\n");
    fprintf(stderr, "\t\tmodjpeg --input in.jpg --pixelate --position tr --dropon logo.jpg --output out.jpg\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\tPlace a logo in the top right corner and then pixelate the image (including the logo):\n");
    fprintf(stderr, "\t\tmodjpeg --input in.jpg --position tr --dropon logo.jpg --pixelate --output out.jpg\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\n");
    return;
}